

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O0

CURLcode Curl_dyn_vaddf(dynbuf *s,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  int rc;
  __va_list_tag *ap_local;
  char *fmt_local;
  dynbuf *s_local;
  
  iVar1 = Curl_dyn_vprintf(s,fmt,ap);
  if (iVar1 == 0) {
    s_local._4_4_ = CURLE_OK;
  }
  else {
    s_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return s_local._4_4_;
}

Assistant:

CURLcode Curl_dyn_vaddf(struct dynbuf *s, const char *fmt, va_list ap)
{
#ifdef BUILDING_LIBCURL
  int rc;
  DEBUGASSERT(s);
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(!s->leng || s->bufr);
  rc = Curl_dyn_vprintf(s, fmt, ap);

  if(!rc)
    return CURLE_OK;
#else
  char *str;
  str = vaprintf(fmt, ap); /* this allocs a new string to append */

  if(str) {
    CURLcode result = dyn_nappend(s, (unsigned char *)str, strlen(str));
    free(str);
    return result;
  }
  /* If we failed, we cleanup the whole buffer and return error */
  Curl_dyn_free(s);
#endif
  return CURLE_OUT_OF_MEMORY;
}